

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

QBitArray * __thiscall QHeaderViewPrivate::sectionsHiddenToBitVector(QHeaderViewPrivate *this)

{
  long lVar1;
  bool bVar2;
  QBitRef *this_00;
  qsizetype qVar3;
  const_reference pSVar4;
  long in_RSI;
  QBitArray *in_RDI;
  long in_FS_OFFSET;
  int u;
  QBitArray *sectionHidden;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QBitArray *this_01;
  int local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QBitArray::QBitArray((QBitArray *)0x8461c1);
  bVar2 = QHash<int,_int>::isEmpty((QHash<int,_int> *)(in_RSI + 0x5a0));
  if (!bVar2) {
    QList<QHeaderViewPrivate::SectionItem>::size
              ((QList<QHeaderViewPrivate::SectionItem> *)(in_RSI + 0x638));
    QBitArray::resize((longlong)this_01);
    local_30 = 0;
    while( true ) {
      this_00 = (QBitRef *)(long)local_30;
      qVar3 = QList<QHeaderViewPrivate::SectionItem>::size
                        ((QList<QHeaderViewPrivate::SectionItem> *)(in_RSI + 0x638));
      if (qVar3 <= (long)this_00) break;
      pSVar4 = QList<QHeaderViewPrivate::SectionItem>::at
                         ((QList<QHeaderViewPrivate::SectionItem> *)this_00,
                          CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffaf = (*(uint *)pSVar4 >> 0x14 & 1) != 0;
      QBitArray::operator[](this_01,(qsizetype)this_00);
      QBitRef::operator=(this_00,(bool)in_stack_ffffffffffffffaf);
      local_30 = local_30 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QBitArray sectionsHiddenToBitVector() const
    {
        QBitArray sectionHidden;
        if (!hiddenSectionSize.isEmpty()) {
            sectionHidden.resize(sectionItems.size());
            for (int u = 0; u < sectionItems.size(); ++u)
                sectionHidden[u] = sectionItems.at(u).isHidden;
        }
        return sectionHidden;
    }